

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-customop.c
# Opt level: O0

void custom(ggml_tensor *dst,int ith,int nth,void *userdata)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  char *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  float *src4_data;
  float *src3_data;
  float *src2_data;
  float *src1_data;
  float *src0_data;
  int32_t *dst_data;
  ggml_tensor *src4;
  ggml_tensor *src3;
  ggml_tensor *src2;
  ggml_tensor *src1;
  ggml_tensor *src0;
  int local_74;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x98);
  uVar2 = *(undefined8 *)(in_RDI + 0xa0);
  uVar3 = *(undefined8 *)(in_RDI + 0xa8);
  uVar4 = *(undefined8 *)(in_RDI + 0xb0);
  uVar5 = *(undefined8 *)(in_RDI + 0xb8);
  lVar8 = ggml_get_data(in_RDI);
  lVar9 = ggml_get_data_f32(uVar1);
  lVar10 = ggml_get_data_f32(uVar2);
  lVar11 = ggml_get_data_f32(uVar3);
  lVar12 = ggml_get_data_f32(uVar4);
  lVar13 = ggml_get_data_f32(uVar5);
  if (in_RCX != g_userdata) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x91,"GGML_ASSERT(%s) failed","userdata == g_userdata");
  }
  iVar7 = strcmp(in_RCX,"ggml");
  if (iVar7 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x92,"GGML_ASSERT(%s) failed","strcmp(userdata, \"ggml\") == 0");
  }
  uVar14 = ggml_is_contiguous(in_RDI);
  if ((uVar14 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x95,"GGML_ASSERT(%s) failed","ggml_is_contiguous(dst)");
  }
  uVar14 = ggml_is_contiguous(uVar1);
  if ((uVar14 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x96,"GGML_ASSERT(%s) failed","ggml_is_contiguous(src0)");
  }
  uVar14 = ggml_is_contiguous(uVar2);
  if ((uVar14 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x97,"GGML_ASSERT(%s) failed","ggml_is_contiguous(src1)");
  }
  uVar14 = ggml_is_contiguous(uVar3);
  if ((uVar14 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x98,"GGML_ASSERT(%s) failed","ggml_is_contiguous(src2)");
  }
  uVar14 = ggml_is_contiguous(uVar4);
  if ((uVar14 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x99,"GGML_ASSERT(%s) failed","ggml_is_contiguous(src3)");
  }
  uVar14 = ggml_is_contiguous(uVar5);
  if ((uVar14 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x9a,"GGML_ASSERT(%s) failed","ggml_is_contiguous(src4)");
  }
  uVar14 = ggml_are_same_shape(in_RDI,uVar1);
  if ((uVar14 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x9d,"GGML_ASSERT(%s) failed","ggml_are_same_shape(dst, src0)");
  }
  uVar14 = ggml_are_same_shape(in_RDI,uVar2);
  if ((uVar14 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x9e,"GGML_ASSERT(%s) failed","ggml_are_same_shape(dst, src1)");
  }
  uVar14 = ggml_are_same_shape(in_RDI,uVar3);
  if ((uVar14 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0x9f,"GGML_ASSERT(%s) failed","ggml_are_same_shape(dst, src2)");
  }
  uVar14 = ggml_are_same_shape(in_RDI,uVar4);
  if ((uVar14 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0xa0,"GGML_ASSERT(%s) failed","ggml_are_same_shape(dst, src3)");
  }
  uVar14 = ggml_are_same_shape(in_RDI,uVar5);
  local_74 = in_ESI;
  if ((uVar14 & 1) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
               ,0xa1,"GGML_ASSERT(%s) failed","ggml_are_same_shape(dst, src4)");
  }
  for (; lVar15 = ggml_nelements(in_RDI), local_74 < lVar15; local_74 = in_EDX + local_74) {
    auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar11 + (long)local_74 * 4)),
                             ZEXT416(*(uint *)(lVar10 + (long)local_74 * 4)),
                             ZEXT416(*(uint *)(lVar9 + (long)local_74 * 4)));
    auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar13 + (long)local_74 * 4)),
                             ZEXT416(*(uint *)(lVar12 + (long)local_74 * 4) ^ 0x80000000),auVar6);
    *(int *)(lVar8 + (long)local_74 * 4) = (int)auVar6._0_4_;
  }
  return;
}

Assistant:

void custom(struct ggml_tensor * dst, int ith, int nth, void * userdata) {
    struct ggml_tensor * src0 = dst->src[0];
    struct ggml_tensor * src1 = dst->src[1];
    struct ggml_tensor * src2 = dst->src[2];
    struct ggml_tensor * src3 = dst->src[3];
    struct ggml_tensor * src4 = dst->src[4];

    int32_t * dst_data = (int32_t *) ggml_get_data(dst);
    const float * src0_data = ggml_get_data_f32(src0);
    const float * src1_data = ggml_get_data_f32(src1);
    const float * src2_data = ggml_get_data_f32(src2);
    const float * src3_data = ggml_get_data_f32(src3);
    const float * src4_data = ggml_get_data_f32(src4);

    // check that the userdata is correct
    GGML_ASSERT(userdata == g_userdata);
    GGML_ASSERT(strcmp(userdata, "ggml") == 0);

    // check that the tensors are contiguous
    GGML_ASSERT(ggml_is_contiguous(dst));
    GGML_ASSERT(ggml_is_contiguous(src0));
    GGML_ASSERT(ggml_is_contiguous(src1));
    GGML_ASSERT(ggml_is_contiguous(src2));
    GGML_ASSERT(ggml_is_contiguous(src3));
    GGML_ASSERT(ggml_is_contiguous(src4));

    // check that the shapes are the same
    GGML_ASSERT(ggml_are_same_shape(dst, src0));
    GGML_ASSERT(ggml_are_same_shape(dst, src1));
    GGML_ASSERT(ggml_are_same_shape(dst, src2));
    GGML_ASSERT(ggml_are_same_shape(dst, src3));
    GGML_ASSERT(ggml_are_same_shape(dst, src4));


    for (int i = ith; i < ggml_nelements(dst); i += nth) {
        dst_data[i] = src0_data[i] + src1_data[i] * src2_data[i] - src3_data[i] * src4_data[i];
    }
}